

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

SNode * find_SNode(Parser *p,uint state,D_Scope *sc)

{
  SNode *pSVar1;
  SNode *pSVar2;
  SNode **ppSVar3;
  bool bVar4;
  
  ppSVar3 = (p->snode_hash).v;
  if (ppSVar3 == (SNode **)0x0) {
    pSVar2 = (SNode *)0x0;
  }
  else {
    pSVar2 = (SNode *)0x0;
    ppSVar3 = ppSVar3 + (ulong)(state * 0x1000 + (int)sc) % (ulong)(p->snode_hash).m;
    while (pSVar1 = *ppSVar3, pSVar1 != (SNode *)0x0) {
      if (((((long)pSVar1->state - (long)p->t->state) / 0x78 == (ulong)state) &&
          (pSVar1->initial_scope == sc)) && (bVar4 = pSVar2 != (SNode *)0x0, pSVar2 = pSVar1, bVar4)
         ) {
        __assert_fail("!result",
                      "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                      ,0x98,"SNode *find_SNode(Parser *, uint, D_Scope *)");
      }
      ppSVar3 = &pSVar1->bucket_next;
    }
  }
  return pSVar2;
}

Assistant:

SNode *find_SNode(Parser *p, uint state, D_Scope *sc) {
  SNodeHash *ph = &p->snode_hash;
  SNode *sn;
  uint h = SNODE_HASH(state, sc);
  SNode *result = NULL;
  if (ph->v)
    for (sn = ph->v[h % ph->m]; sn; sn = sn->bucket_next)
      if (sn->state - p->t->state == state && sn->initial_scope == sc) {
        assert(!result);
        result = sn;
      }
  return result;
}